

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  uint8_t *puVar2;
  pointer ptVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  result_type rVar7;
  ulong uVar8;
  size_t __i;
  long lVar9;
  ulong uVar10;
  uint32_t *__addr;
  long lVar11;
  uniform_int_distribution<int> dis;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  sigaction act;
  mt19937 gen;
  random_device rd;
  int local_2820;
  int local_281c;
  int local_2818;
  int local_2814;
  uniform_int_distribution<int> local_2810;
  vector<std::thread,_std::allocator<std::thread>_> local_2808;
  ulong local_27f0;
  size_type local_27e8;
  long local_27e0;
  sigaction local_27d8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  if (argc < 3) {
    __assert_fail("argc >= 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/yuyichao[P]explore/general_c/mprotect_mt/main.cpp"
                  ,0x75,"int main(int, char **)");
  }
  memset(&local_27d8,0,0x98);
  sigemptyset(&local_27d8.sa_mask);
  local_27d8.__sigaction_handler.sa_handler = segv_handler;
  local_27d8.sa_flags = 4;
  sigaction(0xb,&local_27d8,(sigaction *)0x0);
  uVar5 = atoi(argv[1]);
  local_2818 = atoi(argv[2]);
  if (0 < local_2818) {
    local_27e8 = (size_type)(int)uVar5;
    uVar10 = (ulong)uVar5;
    local_281c = uVar5 - 1;
    local_27e0 = uVar10 * 0x98;
    lVar1 = uVar10 * 8;
    local_2814 = 0;
    local_27f0 = uVar10;
    do {
      thread_done = false;
      std::vector<thread_data_t,_std::allocator<thread_data_t>_>::resize(&thread_datas,local_27e8);
      std::random_device::random_device(&local_13b8);
      uVar6 = std::random_device::_M_getval();
      local_2740._M_x[0] = (unsigned_long)uVar6;
      lVar9 = 1;
      uVar8 = local_2740._M_x[0];
      do {
        uVar8 = (ulong)(((uint)(uVar8 >> 0x1e) ^ (uint)uVar8) * 0x6c078965 + (int)lVar9);
        local_2740._M_x[lVar9] = uVar8;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x270);
      local_2740._M_p = 0x270;
      local_2810._M_param._M_a = 0;
      local_2810._M_param._M_b = local_281c;
      if ((int)uVar5 < 1) {
        page = (uint32_t *)mmap((void *)0x0,0x1000,1,0x22,-1,0);
        local_2808.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2808.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2808.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else {
        lVar9 = 0;
        do {
          ptVar3 = thread_datas.super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          puVar2 = (thread_datas.super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>.
                    _M_impl.super__Vector_impl_data._M_start)->padding + lVar9 + 0x80;
          puVar2[0] = '\0';
          puVar2[1] = '\0';
          puVar2[2] = '\0';
          puVar2[3] = '\0';
          puVar2[4] = '\0';
          puVar2[5] = '\0';
          puVar2[6] = '\0';
          puVar2[7] = '\0';
          (&ptVar3->triggered)[lVar9] = false;
          rVar7 = std::uniform_int_distribution<int>::operator()
                            (&local_2810,&local_2740,&local_2810._M_param);
          *(result_type *)((long)&ptVar3->other_id + lVar9) = rVar7;
          lVar9 = lVar9 + 0x98;
        } while (local_27e0 != lVar9);
        page = (uint32_t *)mmap((void *)0x0,0x1000,1,0x22,-1,0);
        local_2808.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2808.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2808.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2820 = 0;
        do {
          std::vector<std::thread,std::allocator<std::thread>>::emplace_back<void(&)(int),int&>
                    ((vector<std::thread,std::allocator<std::thread>> *)&local_2808,run_thread_loop,
                     &local_2820);
          local_2820 = local_2820 + 1;
        } while (local_2820 < (int)uVar5);
      }
      usleep(100);
      mprotect(page,0x1000,0);
      if (0 < (int)uVar5) {
        uVar8 = 0;
        do {
          if ((thread_datas.super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar8].triggered & 1U) == 0) {
            do {
            } while ((thread_datas.super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar8].triggered & 1U) == 0);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar10);
      }
      mprotect(page,0x1000,3);
      __addr = page;
      *page = 1;
      thread_done = true;
      if ((int)uVar5 < 1) {
        uVar8 = 0;
      }
      else {
        lVar9 = 0;
        lVar11 = 0x12;
        uVar8 = 0;
        do {
          if ((*(uintptr_t *)
                ((thread_datas.super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>.
                  _M_impl.super__Vector_impl_data._M_start)->padding + lVar11 * 8 + -8) !=
               thread_datas.super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>.
               _M_impl.super__Vector_impl_data._M_start
               [*(int *)((thread_datas.
                          super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>._M_impl.
                          super__Vector_impl_data._M_start)->padding + lVar11 * 8)].self_count) &&
             (*(uintptr_t *)
               ((thread_datas.super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>.
                 _M_impl.super__Vector_impl_data._M_start)->padding + lVar11 * 8 + -8) + 1 !=
              thread_datas.super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>._M_impl
              .super__Vector_impl_data._M_start
              [*(int *)((thread_datas.
                         super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>._M_impl.
                         super__Vector_impl_data._M_start)->padding + lVar11 * 8)].self_count)) {
            uVar8 = (ulong)((int)uVar8 + 1);
            printf("%d, %zu, %zu\n");
          }
          std::thread::join();
          lVar9 = lVar9 + 8;
          lVar11 = lVar11 + 0x13;
          uVar10 = local_27f0;
          __addr = page;
        } while (lVar1 - lVar9 != 0);
      }
      munmap(__addr,0x1000);
      page = (uint32_t *)0x0;
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_2808);
      std::random_device::_M_fini();
      iVar4 = local_2814;
      if ((int)uVar8 != 0) {
        printf("%d\n",uVar8);
      }
      local_2814 = iVar4 + 1;
    } while (local_2814 != local_2818);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    assert(argc >= 3);
    struct sigaction act;
    memset(&act, 0, sizeof(struct sigaction));
    sigemptyset(&act.sa_mask);
    act.sa_sigaction = segv_handler;
    act.sa_flags = SA_SIGINFO;
    sigaction(SIGSEGV, &act, NULL);
    int nt = atoi(argv[1]);
    int n = atoi(argv[2]);
    for (int i = 0;i < n;i++) {
        if (int violation = run_n_threads(nt)) {
            printf("%d\n", violation);
        }
    }
    return 0;
}